

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint auto_choose_color(LodePNGColorMode *mode_out,LodePNGColorMode *mode_in,LodePNGColorStats *stats
                      )

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  LodePNGColorType local_74;
  uint local_6c;
  uint local_68;
  uint mask;
  uchar *p;
  uint local_50;
  uint bits;
  uint key;
  uint alpha;
  uint gray_ok;
  uint palette_ok;
  size_t numpixels;
  size_t n;
  size_t i;
  uint palettebits;
  uint error;
  LodePNGColorStats *stats_local;
  LodePNGColorMode *mode_in_local;
  LodePNGColorMode *mode_out_local;
  
  i._4_4_ = 0;
  uVar1 = stats->numpixels;
  bits = stats->alpha;
  local_50 = stats->key;
  p._4_4_ = stats->bits;
  mode_out->key_defined = 0;
  if ((local_50 != 0) && (uVar1 < 0x11)) {
    bits = 1;
    local_50 = 0;
    if (p._4_4_ < 8) {
      p._4_4_ = 8;
    }
  }
  bVar4 = stats->colored == 0;
  bVar5 = stats->allow_greyscale != 0;
  if ((!bVar5 || !bVar4) && (p._4_4_ < 8)) {
    p._4_4_ = 8;
  }
  uVar3 = (ulong)stats->numcolors;
  if (uVar3 < 3) {
    local_68 = 1;
  }
  else {
    if (uVar3 < 5) {
      local_6c = 2;
    }
    else {
      local_6c = 8;
      if (uVar3 < 0x11) {
        local_6c = 4;
      }
    }
    local_68 = local_6c;
  }
  bVar6 = false;
  if ((uVar3 < 0x101) && (bVar6 = false, p._4_4_ < 9)) {
    bVar6 = uVar3 != 0;
  }
  if (uVar1 < uVar3 << 1) {
    bVar6 = false;
  }
  if (((bVar5 && bVar4) && (bits == 0)) && (p._4_4_ <= local_68)) {
    bVar6 = false;
  }
  if (stats->allow_palette == 0) {
    bVar6 = false;
  }
  if (bVar6) {
    lodepng_palette_clear(mode_out);
    n = 0;
    while ((n != stats->numcolors &&
           (i._4_4_ = lodepng_palette_add(mode_out,stats->palette[n * 4],stats->palette[n * 4 + 1],
                                          stats->palette[n * 4 + 2],stats->palette[n * 4 + 3]),
           i._4_4_ == 0))) {
      n = n + 1;
    }
    mode_out->colortype = LCT_PALETTE;
    mode_out->bitdepth = local_68;
    if (((mode_in->colortype == LCT_PALETTE) && (mode_out->palettesize <= mode_in->palettesize)) &&
       (mode_in->bitdepth == mode_out->bitdepth)) {
      lodepng_color_mode_cleanup(mode_out);
      lodepng_color_mode_copy(mode_out,mode_in);
    }
  }
  else {
    mode_out->bitdepth = p._4_4_;
    if (bits == 0) {
      local_74 = LCT_RGB;
      if (bVar5 && bVar4) {
        local_74 = LCT_GREY;
      }
    }
    else {
      local_74 = LCT_RGBA;
      if (bVar5 && bVar4) {
        local_74 = LCT_GREY_ALPHA;
      }
    }
    mode_out->colortype = local_74;
    if (local_50 != 0) {
      uVar2 = (1 << ((byte)mode_out->bitdepth & 0x1f)) - 1;
      mode_out->key_r = stats->key_r & uVar2;
      mode_out->key_g = stats->key_g & uVar2;
      mode_out->key_b = stats->key_b & uVar2;
      mode_out->key_defined = 1;
    }
  }
  return i._4_4_;
}

Assistant:

static unsigned auto_choose_color(LodePNGColorMode* mode_out,
                                  const LodePNGColorMode* mode_in,
                                  const LodePNGColorStats* stats) {
  unsigned error = 0;
  unsigned palettebits;
  size_t i, n;
  size_t numpixels = stats->numpixels;
  unsigned palette_ok, gray_ok;

  unsigned alpha = stats->alpha;
  unsigned key = stats->key;
  unsigned bits = stats->bits;

  mode_out->key_defined = 0;

  if(key && numpixels <= 16) {
    alpha = 1; /*too few pixels to justify tRNS chunk overhead*/
    key = 0;
    if(bits < 8) bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
  }

  gray_ok = !stats->colored;
  if(!stats->allow_greyscale) gray_ok = 0;
  if(!gray_ok && bits < 8) bits = 8;

  n = stats->numcolors;
  palettebits = n <= 2 ? 1 : (n <= 4 ? 2 : (n <= 16 ? 4 : 8));
  palette_ok = n <= 256 && bits <= 8 && n != 0; /*n==0 means likely numcolors wasn't computed*/
  if(numpixels < n * 2) palette_ok = 0; /*don't add palette overhead if image has only a few pixels*/
  if(gray_ok && !alpha && bits <= palettebits) palette_ok = 0; /*gray is less overhead*/
  if(!stats->allow_palette) palette_ok = 0;

  if(palette_ok) {
    const unsigned char* p = stats->palette;
    lodepng_palette_clear(mode_out); /*remove potential earlier palette*/
    for(i = 0; i != stats->numcolors; ++i) {
      error = lodepng_palette_add(mode_out, p[i * 4 + 0], p[i * 4 + 1], p[i * 4 + 2], p[i * 4 + 3]);
      if(error) break;
    }

    mode_out->colortype = LCT_PALETTE;
    mode_out->bitdepth = palettebits;

    if(mode_in->colortype == LCT_PALETTE && mode_in->palettesize >= mode_out->palettesize
        && mode_in->bitdepth == mode_out->bitdepth) {
      /*If input should have same palette colors, keep original to preserve its order and prevent conversion*/
      lodepng_color_mode_cleanup(mode_out);
      lodepng_color_mode_copy(mode_out, mode_in);
    }
  } else /*8-bit or 16-bit per channel*/ {
    mode_out->bitdepth = bits;
    mode_out->colortype = alpha ? (gray_ok ? LCT_GREY_ALPHA : LCT_RGBA)
                                : (gray_ok ? LCT_GREY : LCT_RGB);
    if(key) {
      unsigned mask = (1u << mode_out->bitdepth) - 1u; /*stats always uses 16-bit, mask converts it*/
      mode_out->key_r = stats->key_r & mask;
      mode_out->key_g = stats->key_g & mask;
      mode_out->key_b = stats->key_b & mask;
      mode_out->key_defined = 1;
    }
  }

  return error;
}